

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

void send_file_data(mg_connection *conn,mg_file *filep,int64_t offset,int64_t len,int no_buffering)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  char *pcVar4;
  size_t sVar5;
  bool local_2091;
  size_t local_2090;
  uint64_t local_2088;
  uint64_t local_2080;
  uint64_t local_2078;
  size_t sf_tosend;
  int loop_cnt;
  int sf_file;
  ssize_t sf_sent;
  off_t sf_offs;
  int64_t size;
  int local_2040;
  int num_written;
  int num_read;
  int to_read;
  char buf [8192];
  size_t sStack_28;
  int no_buffering_local;
  int64_t len_local;
  int64_t offset_local;
  mg_file *filep_local;
  mg_connection *conn_local;
  
  if ((filep != (mg_file *)0x0) && (conn != (mg_connection *)0x0)) {
    if ((filep->stat).size < 0x8000000000000000) {
      local_2078 = (filep->stat).size;
    }
    else {
      local_2078 = 0x7fffffffffffffff;
    }
    sf_offs = local_2078;
    if (offset < 0) {
      local_2080 = 0;
    }
    else {
      local_2088 = offset;
      if ((long)local_2078 < offset) {
        local_2088 = local_2078;
      }
      local_2080 = local_2088;
    }
    len_local = local_2080;
    if ((0 < len) && ((filep->access).fp != (FILE *)0x0)) {
      sStack_28 = len;
      if ((conn->ssl == (SSL *)0x0) &&
         ((conn->throttle == 0 &&
          (iVar1 = mg_strcasecmp(conn->dom_ctx->config[8],"yes"), iVar1 == 0)))) {
        sf_sent = local_2080;
        iVar1 = fileno((FILE *)(filep->access).fp);
        sf_tosend._0_4_ = 0;
        do {
          if ((long)sStack_28 < 0x7ffff000) {
            local_2090 = sStack_28;
          }
          else {
            local_2090 = 0x7ffff000;
          }
          sVar2 = sendfile64((conn->client).sock,iVar1,&sf_sent,local_2090);
          if (sVar2 < 1) {
            if ((int)sf_tosend == 0) break;
            if (sVar2 == 0) {
              return;
            }
          }
          else {
            sStack_28 = sStack_28 - sVar2;
          }
          sf_tosend._0_4_ = (int)sf_tosend + 1;
          local_2091 = 0 < (long)sStack_28 && -1 < sVar2;
        } while (local_2091);
        if (0 < sVar2) {
          return;
        }
        len_local = sf_sent;
      }
      if ((len_local < 1) || (iVar1 = fseeko64((FILE *)(filep->access).fp,len_local,0), iVar1 == 0))
      {
        for (; 0 < (long)sStack_28; sStack_28 = sStack_28 - (long)size._4_4_) {
          num_written = 0x2000;
          if (no_buffering != 0) {
            num_written = 1;
          }
          if ((long)sStack_28 < (long)num_written) {
            num_written = (int)sStack_28;
          }
          sVar5 = fread(&num_read,1,(long)num_written,(FILE *)(filep->access).fp);
          local_2040 = (int)sVar5;
          if (local_2040 < 1) {
            return;
          }
          size._4_4_ = mg_write(conn,&num_read,(long)local_2040);
          if (size._4_4_ != local_2040) {
            return;
          }
        }
      }
      else {
        piVar3 = __errno_location();
        pcVar4 = strerror(*piVar3);
        mg_cry_internal_wrap
                  (conn,(mg_context *)0x0,"send_file_data",0x278c,"%s: fseeko() failed: %s",
                   "send_file_data",pcVar4);
        mg_send_http_error(conn,500,"%s","Error: Unable to access file at requested position.");
      }
    }
  }
  return;
}

Assistant:

static void
send_file_data(struct mg_connection *conn,
               struct mg_file *filep,
               int64_t offset,
               int64_t len,
               int no_buffering)
{
	char buf[MG_BUF_LEN];
	int to_read, num_read, num_written;
	int64_t size;

	if (!filep || !conn) {
		return;
	}

	/* Sanity check the offset */
	size = (filep->stat.size > INT64_MAX) ? INT64_MAX
	                                      : (int64_t)(filep->stat.size);
	offset = (offset < 0) ? 0 : ((offset > size) ? size : offset);

	if (len > 0 && filep->access.fp != NULL) {
		/* file stored on disk */
#if defined(__linux__)
		/* sendfile is only available for Linux */
		if ((conn->ssl == 0) && (conn->throttle == 0)
		    && (!mg_strcasecmp(conn->dom_ctx->config[ALLOW_SENDFILE_CALL],
		                       "yes"))) {
			off_t sf_offs = (off_t)offset;
			ssize_t sf_sent;
			int sf_file = fileno(filep->access.fp);
			int loop_cnt = 0;

			do {
				/* 2147479552 (0x7FFFF000) is a limit found by experiment on
				 * 64 bit Linux (2^31 minus one memory page of 4k?). */
				size_t sf_tosend =
				    (size_t)((len < 0x7FFFF000) ? len : 0x7FFFF000);
				sf_sent =
				    sendfile(conn->client.sock, sf_file, &sf_offs, sf_tosend);
				if (sf_sent > 0) {
					len -= sf_sent;
					offset += sf_sent;
				} else if (loop_cnt == 0) {
					/* This file can not be sent using sendfile.
					 * This might be the case for pseudo-files in the
					 * /sys/ and /proc/ file system.
					 * Use the regular user mode copy code instead. */
					break;
				} else if (sf_sent == 0) {
					/* No error, but 0 bytes sent. May be EOF? */
					return;
				}
				loop_cnt++;

			} while ((len > 0) && (sf_sent >= 0));

			if (sf_sent > 0) {
				return; /* OK */
			}

			/* sf_sent<0 means error, thus fall back to the classic way */
			/* This is always the case, if sf_file is not a "normal" file,
			 * e.g., for sending data from the output of a CGI process. */
			offset = (int64_t)sf_offs;
		}
#endif
		if ((offset > 0) && (fseeko(filep->access.fp, offset, SEEK_SET) != 0)) {
			mg_cry_internal(conn,
			                "%s: fseeko() failed: %s",
			                __func__,
			                strerror(ERRNO));
			mg_send_http_error(
			    conn,
			    500,
			    "%s",
			    "Error: Unable to access file at requested position.");
		} else {
			while (len > 0) {
				/* Calculate how much to read from the file into the buffer. */
				/* If no_buffering is set, we should not wait until the
				 * CGI->Server buffer is filled, but send everything
				 * immediately. In theory buffering could be turned off using
				 * setbuf(filep->access.fp, NULL);
				 * setvbuf(filep->access.fp, NULL, _IONBF, 0);
				 * but in practice this does not work. A "Linux only" solution
				 * may be to use select(). The only portable way is to read byte
				 * by byte, but this is quite inefficient from a performance
				 * point of view. */
				to_read = no_buffering ? 1 : sizeof(buf);
				if ((int64_t)to_read > len) {
					to_read = (int)len;
				}

				/* Read from file, exit the loop on error */
				if ((num_read =
				         (int)fread(buf, 1, (size_t)to_read, filep->access.fp))
				    <= 0) {
					break;
				}

				/* Send read bytes to the client, exit the loop on error */
				if ((num_written = mg_write(conn, buf, (size_t)num_read))
				    != num_read) {
					break;
				}

				/* Both read and were successful, adjust counters */
				len -= num_written;
			}
		}
	}
}